

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall
chrono::ChArchiveAsciiDump::out
          (ChArchiveAsciiDump *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  ChStreamOutAscii *this_00;
  
  indent(this);
  if (this->suppress_names == false) {
    this_00 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal)
    ;
    chrono::ChStreamOutAscii::operator<<(this_00,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"");
  chrono::ChStreamOutAscii::operator<<(this->ostream,*(string **)(bVal + 8));
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<std::string> bVal){
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << "\"";
            (*ostream) << bVal.value();
            (*ostream) << "\"\n";
      }